

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

void glcts::TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect
               (_test_result *test_result,GLenum glMaxTessGenLevelToken)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  Context *this;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar4;
  pointer ppVar5;
  size_type sVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  TestError *this_01;
  float fVar8;
  MessageBuilder local_248;
  TestContext *local_c8;
  TestContext *test;
  pair<float,_float> *local_b8;
  float *local_b0;
  float *found_vertex2_x;
  float *found_vertex1_x;
  __normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  local_98;
  _line_segments_iterator found_line_segments_iterator;
  float vertex2_x;
  float *vertex2;
  reference pvStack_78;
  float vertex1_x;
  float *vertex1;
  uint local_68;
  uint uStack_64;
  bool was_line_segment_found;
  uint n_vertex;
  uint n_unique_line_segments_found;
  uint n_line_segments_per_isoline_expected;
  float outer_tess_levels1_clamped_rounded;
  GLint gl_max_tess_gen_level_value;
  long local_48;
  Functions *gl;
  _line_segments found_line_segments;
  float epsilon;
  Context *context;
  GLenum glMaxTessGenLevelToken_local;
  _test_result *test_result_local;
  
  this = getContext(test_result->parent->parent);
  found_line_segments.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3727c5ac;
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)&gl);
  pRVar3 = deqp::Context::getRenderContext(this);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_48 = CONCAT44(extraout_var,iVar2);
  n_line_segments_per_isoline_expected = 0;
  n_unique_line_segments_found = 0;
  n_vertex = 0;
  uStack_64 = 0;
  if (test_result->n_vertices != 0) {
    (**(code **)(local_48 + 0x868))(glMaxTessGenLevelToken,&n_line_segments_per_isoline_expected);
    err = (**(code **)(local_48 + 0x800))();
    glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                    ,0xfa);
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (test_result->parent->vertex_spacing_mode,test_result->parent->outer_tess_levels[1],
               n_line_segments_per_isoline_expected,(float *)0x0,
               (float *)&n_unique_line_segments_found);
    n_vertex = (uint)(long)(float)n_unique_line_segments_found;
    for (local_68 = 0; local_68 < test_result->n_vertices; local_68 = local_68 + 2) {
      vertex1._7_1_ = 0;
      pvStack_78 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&test_result->rendered_data,0);
      pvStack_78 = pvStack_78 + local_68 * 3;
      vertex2._4_4_ = *pvStack_78;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&test_result->rendered_data,0)
      ;
      found_line_segments_iterator._M_current._4_4_ = pvVar4[(local_68 + 1) * 3];
      local_98._M_current =
           (pair<float,_float> *)
           std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::begin
                     ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                      &gl);
      while( true ) {
        found_vertex1_x =
             (float *)std::
                      vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                      end((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           *)&gl);
        bVar1 = __gnu_cxx::operator!=
                          (&local_98,
                           (__normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                            *)&found_vertex1_x);
        if (!bVar1) break;
        found_vertex2_x =
             &__gnu_cxx::
              __normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
              ::operator->(&local_98)->first;
        ppVar5 = __gnu_cxx::
                 __normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                 ::operator->(&local_98);
        local_b0 = &ppVar5->second;
        fVar8 = de::abs<float>(*found_vertex2_x - vertex2._4_4_);
        if ((fVar8 < 1e-05) &&
           (fVar8 = de::abs<float>(*local_b0 - found_line_segments_iterator._M_current._4_4_),
           fVar8 < 1e-05)) {
          vertex1._7_1_ = 1;
          break;
        }
        local_b8 = (pair<float,_float> *)
                   __gnu_cxx::
                   __normal_iterator<std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                   ::operator++(&local_98,0);
      }
      if ((vertex1._7_1_ & 1) == 0) {
        std::pair<float,_float>::pair<float_&,_float_&,_true>
                  ((pair<float,_float> *)&test,(float *)((long)&vertex2 + 4),
                   (float *)((long)&found_line_segments_iterator._M_current + 4));
        std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::push_back
                  ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)&gl
                   ,(value_type *)&test);
      }
    }
    sVar6 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                      ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *
                       )&gl);
    uStack_64 = (uint)sVar6;
    if (uStack_64 != n_vertex) {
      local_c8 = tcu::TestNode::getTestContext((TestNode *)test_result->parent->parent);
      this_00 = tcu::TestContext::getLog(local_c8);
      tcu::TestLog::operator<<(&local_248,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_248,
                          (char (*) [65])
                          "Tessellator generated an invalid amount of unique line segments:");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xffffffffffffff9c);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [33])" instead of the expected amount:");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&n_vertex);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [59])
                                 " for the following inner tessellation level configuration:");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2afcbee);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->inner_tess_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->inner_tess_levels + 1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [58])
                                 " and the following outer tesellation level configuration:");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2afcbee);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 1);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 2);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,test_result->parent->outer_tess_levels + 3);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [41])" and the following vertex spacing mode: ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&test_result->parent->vertex_spacing_mode);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_248);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid amount of unique line segments generated by tessellator",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                 ,0x136);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::~vector
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)&gl);
  return;
}

Assistant:

void TessellationShadersIsolines::checkSecondOuterTessellationLevelEffect(_test_result&		test_result,
																		  const glw::GLenum glMaxTessGenLevelToken)
{
	typedef float _line_segment_x;
	typedef std::pair<_line_segment_x, _line_segment_x> _line_segment;
	typedef std::vector<_line_segment> _line_segments;
	typedef _line_segments::iterator   _line_segments_iterator;

	glcts::Context&		  context = test_result.parent->parent->getContext();
	const float			  epsilon = 1e-5f;
	_line_segments		  found_line_segments;
	const glw::Functions& gl								   = context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value		   = 0;
	float				  outer_tess_levels1_clamped_rounded   = 0.0f;
	unsigned int		  n_line_segments_per_isoline_expected = 0;
	unsigned int		  n_unique_line_segments_found		   = 0;

	if (test_result.n_vertices != 0)
	{
		/* Calculate how many isolines we're expecting */
		gl.getIntegerv(glMaxTessGenLevelToken, &gl_max_tess_gen_level_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			test_result.parent->vertex_spacing_mode, test_result.parent->outer_tess_levels[1],
			gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outer_tess_levels1_clamped_rounded);

		n_line_segments_per_isoline_expected = (unsigned int)outer_tess_levels1_clamped_rounded;

		/* Count unique line segments found in all the line segments making up the result data set.  */
		for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices;
			 n_vertex += 2 /* vertices per line segment */)
		{
			bool		 was_line_segment_found = false;
			const float* vertex1				= (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
			float		 vertex1_x				= vertex1[0];
			const float* vertex2				= (&test_result.rendered_data[0]) + (n_vertex + 1) * 3; /* components */
			float		 vertex2_x				= vertex2[0];

			for (_line_segments_iterator found_line_segments_iterator = found_line_segments.begin();
				 found_line_segments_iterator != found_line_segments.end(); found_line_segments_iterator++)
			{
				float& found_vertex1_x = found_line_segments_iterator->first;
				float& found_vertex2_x = found_line_segments_iterator->second;

				if (de::abs(found_vertex1_x - vertex1_x) < epsilon && de::abs(found_vertex2_x - vertex2_x) < epsilon)
				{
					was_line_segment_found = true;

					break;
				}
			} /* for (all found Ys) */

			if (!was_line_segment_found)
			{
				found_line_segments.push_back(_line_segment(vertex1_x, vertex2_x));
			}
		} /* for (all vertices) */

		/* Compare the values */
		n_unique_line_segments_found = (unsigned int)found_line_segments.size();

		if (n_unique_line_segments_found != n_line_segments_per_isoline_expected)
		{
			tcu::TestContext& test = test_result.parent->parent->getTestContext();

			test.getLog() << tcu::TestLog::Message << "Tessellator generated an invalid amount of unique line segments:"
						  << n_unique_line_segments_found
						  << " instead of the expected amount:" << n_line_segments_per_isoline_expected
						  << " for the following inner tessellation level configuration:"
						  << " (" << test_result.parent->inner_tess_levels[0] << ", "
						  << test_result.parent->inner_tess_levels[1] << ")"
						  << " and the following outer tesellation level configuration:"
						  << " (" << test_result.parent->outer_tess_levels[0] << ", "
						  << test_result.parent->outer_tess_levels[1] << ", "
						  << test_result.parent->outer_tess_levels[2] << ", "
						  << test_result.parent->outer_tess_levels[3] << ")"
						  << " and the following vertex spacing mode: " << test_result.parent->vertex_spacing_mode
						  << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid amount of unique line segments generated by tessellator");
		}
	} /* if (test_run.n_vertices != 0) */
}